

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::framebufferRenderbuffer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 renderbuffertarget,
          deUint32 renderbuffer)

{
  deBool dVar1;
  deUint32 dVar2;
  Framebuffer *local_78;
  int local_64;
  AttachmentType AStack_60;
  int ndx_1;
  TexTarget local_58;
  int iStack_54;
  int local_50;
  int local_4c;
  Attachment *pAStack_48;
  int ndx;
  Attachment *fboAttachment;
  Framebuffer *pFStack_38;
  int bindingRefCount;
  Framebuffer *framebufferBinding;
  Renderbuffer *rbo;
  uint local_20;
  AttachmentPoint point;
  deUint32 renderbuffer_local;
  deUint32 renderbuffertarget_local;
  deUint32 attachment_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  local_20 = renderbuffer;
  point = renderbuffertarget;
  renderbuffer_local = attachment;
  renderbuffertarget_local = target;
  _attachment_local = this;
  if (attachment == 0x821a) {
    (*(this->super_Context)._vptr_Context[0x20])
              (this,(ulong)target,0x8d00,(ulong)renderbuffertarget,(ulong)renderbuffer);
    (*(this->super_Context)._vptr_Context[0x20])
              (this,(ulong)renderbuffertarget_local,0x8d20,(ulong)point,(ulong)local_20);
  }
  else {
    rbo._4_4_ = mapGLAttachmentPoint(attachment);
    framebufferBinding = (Framebuffer *)0x0;
    do {
      if (((renderbuffertarget_local != 0x8d40) && (renderbuffertarget_local != 0x8ca9)) &&
         (renderbuffertarget_local != 0x8ca8)) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      if (rbo._4_4_ == ATTACHMENTPOINT_LAST) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    if ((renderbuffertarget_local == 0x8d40) || (renderbuffertarget_local == 0x8ca9)) {
      local_78 = this->m_drawFramebufferBinding;
    }
    else {
      local_78 = this->m_readFramebufferBinding;
    }
    pFStack_38 = local_78;
    do {
      if (pFStack_38 == (Framebuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    fboAttachment._4_4_ =
         (uint)(pFStack_38 == this->m_drawFramebufferBinding) +
         (uint)(pFStack_38 == this->m_readFramebufferBinding);
    if (local_20 != 0) {
      framebufferBinding =
           (Framebuffer *)
           rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,local_20);
      do {
        if (point != 0x8d41) {
          setError(this,0x500);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      do {
        if (framebufferBinding == (Framebuffer *)0x0) {
          setError(this,0x502);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
    }
    pAStack_48 = rc::Framebuffer::getAttachment(pFStack_38,rbo._4_4_);
    for (local_4c = 0; local_4c < fboAttachment._4_4_; local_4c = local_4c + 1) {
      releaseFboAttachmentReference(this,pAStack_48);
    }
    rc::Framebuffer::Attachment::Attachment((Attachment *)&stack0xffffffffffffffa0);
    pAStack_48->type = AStack_60;
    pAStack_48->name = ndx_1;
    pAStack_48->texTarget = local_58;
    pAStack_48->level = iStack_54;
    pAStack_48->layer = local_50;
    if (framebufferBinding != (Framebuffer *)0x0) {
      pAStack_48->type = ATTACHMENTTYPE_RENDERBUFFER;
      dVar2 = rc::NamedObject::getName(&framebufferBinding->super_NamedObject);
      pAStack_48->name = dVar2;
      for (local_64 = 0; local_64 < fboAttachment._4_4_; local_64 = local_64 + 1) {
        acquireFboAttachmentReference(this,pAStack_48);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferRenderbuffer (deUint32 target, deUint32 attachment, deUint32 renderbuffertarget, deUint32 renderbuffer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach both to depth and stencil.
		framebufferRenderbuffer(target, GL_DEPTH_ATTACHMENT,	renderbuffertarget, renderbuffer);
		framebufferRenderbuffer(target, GL_STENCIL_ATTACHMENT,	renderbuffertarget, renderbuffer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Renderbuffer*					rbo				= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (renderbuffer != 0)
		{
			rbo = m_renderbuffers.find(renderbuffer);

			RC_IF_ERROR(renderbuffertarget != GL_RENDERBUFFER,	GL_INVALID_ENUM,		RC_RET_VOID);
			RC_IF_ERROR(!rbo,									GL_INVALID_OPERATION,	RC_RET_VOID);
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (rbo)
		{
			fboAttachment.type	= Framebuffer::ATTACHMENTTYPE_RENDERBUFFER;
			fboAttachment.name	= rbo->getName();

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}